

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionContext.h
# Opt level: O1

StackFrame * __thiscall
Js::JavascriptExceptionContext::StackFrame::operator=(StackFrame *this,StackFrame *other)

{
  FunctionBody *pFVar1;
  anon_union_8_2_4da9e1e4_for_StackFrame_1 aVar2;
  
  pFVar1 = (other->functionBody).ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->functionBody).ptr = pFVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  aVar2 = other->field_1;
  Memory::Recycler::WBSetBit((char *)&(this->field_1).byteCodeOffset);
  this->field_1 = aVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_1);
  (this->argumentTypes).types = (other->argumentTypes).types;
  return this;
}

Assistant:

StackFrame& operator=(const StackFrame& other)
            {
                functionBody = other.functionBody;
                name = other.name;
                argumentTypes = other.argumentTypes;
                return *this;
            }